

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

ostream * operator<<(ostream *o,Address *a)

{
  ostream *poVar1;
  string *psVar2;
  Address *a_local;
  ostream *o_local;
  
  poVar1 = std::operator<<(o,"country: ");
  psVar2 = Address::getCountry_abi_cxx11_(a);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,", city: ");
  psVar2 = Address::getCity_abi_cxx11_(a);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  poVar1 = std::operator<<(poVar1,", street: ");
  psVar2 = Address::getStreet_abi_cxx11_(a);
  std::operator<<(poVar1,(string *)psVar2);
  return o;
}

Assistant:

ostream& operator <<(ostream& o, const Address& a) {

    o << "country: " << a.getCountry() << ", city: " << a.getCity() << ", street: " << a.getStreet();
    return o;
}